

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void Catch::anon_unknown_1::printTotals(ostream *out,Totals *totals)

{
  size_t sVar1;
  size_t sVar2;
  ostream *poVar3;
  long in_RSI;
  ostream *in_RDI;
  Colour colour_2;
  Colour colour_1;
  string qualify_assertions_failed;
  Colour colour;
  undefined4 in_stack_fffffffffffffc08;
  Code in_stack_fffffffffffffc0c;
  pluralise *in_stack_fffffffffffffc10;
  size_t in_stack_fffffffffffffc38;
  allocator local_2d1;
  string local_2d0 [79];
  allocator local_281;
  string local_280 [72];
  string local_238 [39];
  allocator local_211;
  string local_210 [79];
  allocator local_1c1;
  string local_1c0 [79];
  allocator local_171;
  string local_170 [72];
  string local_128 [39];
  allocator local_101;
  string local_100 [79];
  allocator local_b1;
  string local_b0 [72];
  string local_68 [48];
  string local_38 [40];
  long local_10;
  ostream *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  sVar1 = Counts::total((Counts *)(in_RSI + 0x20));
  if (sVar1 == 0) {
    std::operator<<(local_8,"No tests ran.");
  }
  else {
    sVar1 = *(size_t *)(local_10 + 0x28);
    sVar2 = Counts::total((Counts *)(local_10 + 0x20));
    if (sVar1 == sVar2) {
      Colour::Colour((Colour *)in_stack_fffffffffffffc10,in_stack_fffffffffffffc0c);
      sVar1 = *(size_t *)(local_10 + 0x10);
      sVar2 = Counts::total((Counts *)(local_10 + 8));
      if (sVar1 == sVar2) {
        ::(anonymous_namespace)::bothOrAll_abi_cxx11_(in_stack_fffffffffffffc38);
      }
      else {
        std::__cxx11::string::string(local_38);
      }
      poVar3 = std::operator<<(local_8,"Failed ");
      ::(anonymous_namespace)::bothOrAll_abi_cxx11_(in_stack_fffffffffffffc38);
      std::operator<<(poVar3,local_68);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b0,"test case",&local_b1);
      pluralise::pluralise
                (in_stack_fffffffffffffc10,
                 CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),(string *)0x26acdd);
      poVar3 = Catch::operator<<((ostream *)in_stack_fffffffffffffc10,
                                 (pluralise *)
                                 CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
      poVar3 = std::operator<<(poVar3,", failed ");
      std::operator<<(poVar3,local_38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_100,"assertion",&local_101);
      pluralise::pluralise
                (in_stack_fffffffffffffc10,
                 CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),(string *)0x26ad9f);
      poVar3 = Catch::operator<<((ostream *)in_stack_fffffffffffffc10,
                                 (pluralise *)
                                 CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
      std::operator<<(poVar3,'.');
      pluralise::~pluralise((pluralise *)0x26ade1);
      std::__cxx11::string::~string(local_100);
      std::allocator<char>::~allocator((allocator<char> *)&local_101);
      pluralise::~pluralise((pluralise *)0x26ae08);
      std::__cxx11::string::~string(local_b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_b1);
      std::__cxx11::string::~string(local_68);
      std::__cxx11::string::~string(local_38);
      Colour::~Colour((Colour *)0x26ae49);
    }
    else {
      sVar1 = Counts::total((Counts *)(local_10 + 8));
      if (sVar1 == 0) {
        poVar3 = std::operator<<(local_8,"Passed ");
        Counts::total((Counts *)(local_10 + 0x20));
        ::(anonymous_namespace)::bothOrAll_abi_cxx11_(in_stack_fffffffffffffc38);
        std::operator<<(poVar3,local_128);
        Counts::total((Counts *)(local_10 + 0x20));
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_170,"test case",&local_171);
        pluralise::pluralise
                  (in_stack_fffffffffffffc10,
                   CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),(string *)0x26b083)
        ;
        poVar3 = Catch::operator<<((ostream *)in_stack_fffffffffffffc10,
                                   (pluralise *)
                                   CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
        std::operator<<(poVar3," (no assertions).");
        pluralise::~pluralise((pluralise *)0x26b0c7);
        std::__cxx11::string::~string(local_170);
        std::allocator<char>::~allocator((allocator<char> *)&local_171);
        std::__cxx11::string::~string(local_128);
      }
      else if (*(long *)(local_10 + 0x10) == 0) {
        Colour::Colour((Colour *)in_stack_fffffffffffffc10,in_stack_fffffffffffffc0c);
        poVar3 = std::operator<<(local_8,"Passed ");
        ::(anonymous_namespace)::bothOrAll_abi_cxx11_(in_stack_fffffffffffffc38);
        std::operator<<(poVar3,local_238);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_280,"test case",&local_281);
        pluralise::pluralise
                  (in_stack_fffffffffffffc10,
                   CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),(string *)0x26b4f7)
        ;
        poVar3 = Catch::operator<<((ostream *)in_stack_fffffffffffffc10,
                                   (pluralise *)
                                   CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
        std::operator<<(poVar3," with ");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_2d0,"assertion",&local_2d1);
        pluralise::pluralise
                  (in_stack_fffffffffffffc10,
                   CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),(string *)0x26b582)
        ;
        poVar3 = Catch::operator<<((ostream *)in_stack_fffffffffffffc10,
                                   (pluralise *)
                                   CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
        std::operator<<(poVar3,'.');
        pluralise::~pluralise((pluralise *)0x26b5bb);
        std::__cxx11::string::~string(local_2d0);
        std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
        pluralise::~pluralise((pluralise *)0x26b5e2);
        std::__cxx11::string::~string(local_280);
        std::allocator<char>::~allocator((allocator<char> *)&local_281);
        std::__cxx11::string::~string(local_238);
        Colour::~Colour((Colour *)0x26b616);
      }
      else {
        Colour::Colour((Colour *)in_stack_fffffffffffffc10,in_stack_fffffffffffffc0c);
        std::operator<<(local_8,"Failed ");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1c0,"test case",&local_1c1);
        pluralise::pluralise
                  (in_stack_fffffffffffffc10,
                   CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),(string *)0x26b223)
        ;
        poVar3 = Catch::operator<<((ostream *)in_stack_fffffffffffffc10,
                                   (pluralise *)
                                   CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
        std::operator<<(poVar3,", failed ");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_210,"assertion",&local_211);
        pluralise::pluralise
                  (in_stack_fffffffffffffc10,
                   CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),(string *)0x26b2b1)
        ;
        poVar3 = Catch::operator<<((ostream *)in_stack_fffffffffffffc10,
                                   (pluralise *)
                                   CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
        std::operator<<(poVar3,'.');
        pluralise::~pluralise((pluralise *)0x26b2ea);
        std::__cxx11::string::~string(local_210);
        std::allocator<char>::~allocator((allocator<char> *)&local_211);
        pluralise::~pluralise((pluralise *)0x26b311);
        std::__cxx11::string::~string(local_1c0);
        std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
        Colour::~Colour((Colour *)0x26b338);
      }
    }
  }
  return;
}

Assistant:

void printTotals(std::ostream& out, const Totals& totals) {
    if (totals.testCases.total() == 0) {
        out << "No tests ran.";
    } else if (totals.testCases.failed == totals.testCases.total()) {
        Colour colour(Colour::ResultError);
        const std::string qualify_assertions_failed =
            totals.assertions.failed == totals.assertions.total() ?
            bothOrAll(totals.assertions.failed) : std::string();
        out <<
            "Failed " << bothOrAll(totals.testCases.failed)
            << pluralise(totals.testCases.failed, "test case") << ", "
            "failed " << qualify_assertions_failed <<
            pluralise(totals.assertions.failed, "assertion") << '.';
    } else if (totals.assertions.total() == 0) {
        out <<
            "Passed " << bothOrAll(totals.testCases.total())
            << pluralise(totals.testCases.total(), "test case")
            << " (no assertions).";
    } else if (totals.assertions.failed) {
        Colour colour(Colour::ResultError);
        out <<
            "Failed " << pluralise(totals.testCases.failed, "test case") << ", "
            "failed " << pluralise(totals.assertions.failed, "assertion") << '.';
    } else {
        Colour colour(Colour::ResultSuccess);
        out <<
            "Passed " << bothOrAll(totals.testCases.passed)
            << pluralise(totals.testCases.passed, "test case") <<
            " with " << pluralise(totals.assertions.passed, "assertion") << '.';
    }
}